

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::
AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,std::__cxx11::string>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          char *more,char *more_1,char *more_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_50,(string *)more_3);
  AddProperties<char_const*,char_const*,char_const*,std::__cxx11::string>
            (this,more,more_1,more_2,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }